

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iStart;
  int *piVar1;
  BYTE *iLimit;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  BYTE *pBVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  U32 UVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  ulong uVar12;
  BYTE *ip;
  BYTE *pBVar13;
  seqDef *psVar14;
  int *piVar15;
  int *ip_00;
  U32 UVar16;
  U32 UVar17;
  U32 UVar18;
  size_t offsetFound;
  size_t local_58;
  U32 *local_50;
  BYTE *local_48;
  ZSTD_matchState_t *local_40;
  BYTE *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  iStart = pBVar3 + uVar2;
  UVar18 = *rep;
  UVar16 = rep[1];
  pZVar4 = ms->dictMatchState;
  pBVar5 = (pZVar4->window).nextSrc;
  local_38 = (pZVar4->window).base;
  local_48 = local_38 + (pZVar4->window).dictLimit;
  ms->nextToUpdate3 = ms->nextToUpdate;
  iLimit = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  ip_00 = (int *)((ulong)(((int)src - (int)iStart) + (int)pBVar5 == (int)local_48) + (long)src);
  if (ip_00 < piVar1) {
    uVar6 = ((int)local_38 - (int)pBVar5) + uVar2;
    pBVar10 = local_38 + -(ulong)uVar6;
    local_50 = rep;
    local_40 = ms;
    do {
      uVar7 = (((int)ip_00 - (int)pBVar3) - UVar18) + 1;
      piVar15 = (int *)(pBVar3 + uVar7);
      if (uVar7 < uVar2) {
        piVar15 = (int *)(local_38 + (uVar7 - uVar6));
      }
      UVar17 = UVar18;
      if ((uVar7 - uVar2 < 0xfffffffd) && (*piVar15 == *(int *)((long)ip_00 + 1))) {
        pBVar11 = iLimit;
        if (uVar7 < uVar2) {
          pBVar11 = pBVar5;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)ip_00 + 5),(BYTE *)(piVar15 + 1),iLimit,pBVar11,iStart);
        sVar8 = sVar8 + 4;
        UVar9 = 1;
        ip_00 = (int *)((long)ip_00 + 1);
LAB_00427380:
        uVar12 = (long)ip_00 - (long)src;
        pBVar13 = seqStore->lit;
        pBVar11 = pBVar13 + uVar12;
        do {
          *(undefined8 *)pBVar13 = *src;
          pBVar13 = pBVar13 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar13 < pBVar11);
        seqStore->lit = seqStore->lit + uVar12;
        if (uVar12 < 0x10000) {
          psVar14 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar14 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar14->litLength = (U16)uVar12;
        psVar14->offset = UVar9;
        if (0xffff < sVar8 - 3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar14->matchLength = (U16)(sVar8 - 3);
        seqStore->sequences = psVar14 + 1;
        for (ip_00 = (int *)((long)ip_00 + sVar8); UVar18 = UVar17, src = ip_00, ip_00 <= piVar1;
            ip_00 = (int *)((long)ip_00 + sVar8 + 4)) {
          uVar7 = ((int)ip_00 - (int)pBVar3) - UVar16;
          pBVar11 = pBVar3;
          if (uVar7 < uVar2) {
            pBVar11 = pBVar10;
          }
          if ((0xfffffffc < uVar7 - uVar2) || (*(int *)(pBVar11 + uVar7) != *ip_00)) break;
          pBVar13 = iLimit;
          if (uVar7 < uVar2) {
            pBVar13 = pBVar5;
          }
          sVar8 = ZSTD_count_2segments
                            ((BYTE *)(ip_00 + 1),(BYTE *)((long)(pBVar11 + uVar7) + 4),iLimit,
                             pBVar13,iStart);
          *(undefined8 *)seqStore->lit = *(undefined8 *)ip_00;
          psVar14 = seqStore->sequences;
          psVar14->litLength = 0;
          psVar14->offset = 1;
          if (0xffff < sVar8 + 1) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar14->matchLength = (U16)(sVar8 + 1);
          seqStore->sequences = psVar14 + 1;
          UVar17 = UVar16;
          UVar16 = UVar18;
        }
      }
      else {
        local_58 = 999999999;
        sVar8 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                          (local_40,(BYTE *)ip_00,iLimit,&local_58);
        if (3 < sVar8) {
          if (local_58 == 0) {
            UVar9 = 1;
          }
          else {
            uVar12 = (long)ip_00 + (-(long)pBVar3 - local_58) + -0xfffffffe;
            pBVar13 = pBVar3;
            pBVar11 = iStart;
            if ((uint)uVar12 < uVar2) {
              pBVar13 = pBVar10;
              pBVar11 = local_48;
            }
            if ((src < ip_00) && (uVar12 = uVar12 & 0xffffffff, pBVar11 < pBVar13 + uVar12)) {
              pBVar13 = pBVar13 + uVar12;
              do {
                piVar15 = (int *)((long)ip_00 + -1);
                pBVar13 = pBVar13 + -1;
                if ((*(BYTE *)piVar15 != *pBVar13) ||
                   (sVar8 = sVar8 + 1, ip_00 = piVar15, piVar15 <= src)) break;
              } while (pBVar11 < pBVar13);
            }
            UVar9 = (int)local_58 + 1;
            UVar17 = (int)local_58 - 2;
            UVar16 = UVar18;
          }
          goto LAB_00427380;
        }
        ip_00 = (int *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
      }
      rep = local_50;
    } while (ip_00 < piVar1);
  }
  *rep = UVar18;
  rep[1] = UVar16;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 0, ZSTD_dictMatchState);
}